

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall caffe::NetState::MergePartialFromCodedStream(NetState *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  InternalMetadataWithArena *this_01;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  Rep *pRVar4;
  Arena *this_02;
  char *data;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  string *value;
  Type *pTVar8;
  int iVar9;
  UnknownFieldSet *pUVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  
  this_00 = &this->stage_;
  this_01 = &this->_internal_metadata_;
  do {
    iVar9 = 7;
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003acffc;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003acffc:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar13 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar6 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) {
LAB_003ad01e:
      if ((uVar12 & 7) != 4 && uVar12 != 0) {
        pvVar3 = (this_01->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_01->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar12,pUVar10);
        iVar9 = 6;
        if (bVar5) {
LAB_003ad0a0:
          iVar9 = 0;
        }
      }
    }
    else {
      uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
      cVar11 = (char)uVar13;
      if (uVar7 == 3) {
        if (cVar11 != '\x1a') goto LAB_003ad01e;
        pRVar4 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_003ad117:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,
                     (this->stage_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_003ad127:
          pRVar4 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
          pRVar4->allocated_size = pRVar4->allocated_size + 1;
          this_02 = (this->stage_).super_RepeatedPtrFieldBase.arena_;
          if (this_02 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    google::protobuf::Arena::AllocateAligned
                              (this_02,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (this_02,value,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          }
          pRVar4 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
          iVar9 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
          (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
          pRVar4->elements[iVar9] = value;
        }
        else {
          iVar9 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar9) {
            if (pRVar4->allocated_size == (this->stage_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_003ad117;
            goto LAB_003ad127;
          }
          (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
          value = (string *)pRVar4->elements[iVar9];
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        if (bVar5) {
          pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          data = (pTVar8->_M_dataplus)._M_p;
          pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    (data,(int)pTVar8->_M_string_length,PARSE,"caffe.NetState.stage");
          goto LAB_003ad0a0;
        }
      }
      else {
        if (uVar7 != 2) {
          if ((uVar7 != 1) || (cVar11 != '\b')) goto LAB_003ad01e;
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar13 = (ulong)bVar1;
            uVar6 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ad22d;
            input->buffer_ = pbVar2 + 1;
            bVar5 = true;
          }
          else {
            uVar6 = 0;
LAB_003ad22d:
            uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
            bVar5 = -1 < (long)uVar13;
          }
          iVar9 = 6;
          if (bVar5) {
            uVar12 = (uint)uVar13;
            if (uVar12 < 2) {
              *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
              this->phase_ = uVar12;
            }
            else {
              pvVar3 = (this_01->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
              if (((ulong)pvVar3 & 1) == 0) {
                pUVar10 = google::protobuf::internal::
                          InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          ::mutable_unknown_fields_slow
                                    (&this_01->
                                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                    );
              }
              else {
                pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
              }
              google::protobuf::UnknownFieldSet::AddVarint(pUVar10,1,(long)(int)uVar12);
            }
            iVar9 = 0;
          }
          if (bVar5) goto LAB_003ad0a0;
          goto LAB_003ad0a2;
        }
        if (cVar11 != '\x10') goto LAB_003ad01e;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar13 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ad206;
          input->buffer_ = pbVar2 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_003ad206:
          uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar13;
        }
        if (bVar5) {
          this->level_ = (int32)uVar13;
          goto LAB_003ad0a0;
        }
      }
      iVar9 = 6;
    }
LAB_003ad0a2:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool NetState::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetState)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.Phase phase = 1 [default = TEST];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 level = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string stage = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->stage(this->stage_size() - 1).data(),
            this->stage(this->stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetState.stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetState)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetState)
  return false;
#undef DO_
}